

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

int ON_Font::CompareFontNameWideChar(wchar_t *lhs,wchar_t *rhs)

{
  bool bVar1;
  int iVar2;
  ON_SHA1_Hash local_50;
  ON_SHA1_Hash local_3c;
  
  if (lhs == rhs) {
    iVar2 = 0;
  }
  else if (lhs == (wchar_t *)0x0) {
    iVar2 = 1;
  }
  else if (rhs == (wchar_t *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    FontNameHash(&local_3c,lhs,false);
    FontNameHash(&local_50,rhs,false);
    bVar1 = ::operator==(&local_3c,&local_50);
    if (!bVar1) {
      iVar2 = ON_wString::CompareOrdinal(lhs,rhs,true);
    }
  }
  return iVar2;
}

Assistant:

int ON_Font::CompareFontNameWideChar(const wchar_t* lhs, const wchar_t* rhs)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  if (ON_Font::FontNameHash(lhs, false) == ON_Font::FontNameHash(rhs, false))
    return 0;
  return ON_wString::CompareOrdinal(lhs, rhs, true);
}